

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O2

void google::protobuf::DoubleValue::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  long lVar1;
  uint uVar2;
  Nullable<const_char_*> failure_msg;
  DoubleValue *_this;
  DoubleValue *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (DoubleValue *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::DoubleValue_const*,google::protobuf::DoubleValue*>
                          ((DoubleValue **)local_18,&local_20,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wrappers.pb.cc"
               ,0x23d,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18)
    ;
  }
  uVar2 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if (((uVar2 & 1) != 0) && (lVar1 = from_msg[1]._internal_metadata_.ptr_, lVar1 != 0)) {
    *(long *)((long)&local_20->field_0 + 8) = lVar1;
  }
  (local_20->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_20->field_0)._impl_._has_bits_.has_bits_[0] | uVar2;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_20->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void DoubleValue::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<DoubleValue*>(&to_msg);
  auto& from = static_cast<const DoubleValue&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DoubleValue)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (::absl::bit_cast<::uint64_t>(from._internal_value()) != 0) {
      _this->_impl_.value_ = from._impl_.value_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}